

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O0

void speech_prog_elven_down(ROOM_INDEX_DATA *room,CHAR_DATA *ch,char *speech)

{
  bool bVar1;
  char *in_RDX;
  long in_RSI;
  CHAR_DATA *ich;
  ROOM_AFFECT_DATA raf;
  AFFECT_DATA af;
  ROOM_AFFECT_DATA *paf;
  long lVar2;
  ROOM_INDEX_DATA *in_stack_ffffffffffffff30;
  CHAR_DATA *in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff40;
  undefined2 uVar3;
  short sVar4;
  undefined2 in_stack_ffffffffffffff46;
  undefined2 uVar5;
  undefined6 in_stack_ffffffffffffff4a;
  CHAR_DATA *in_stack_ffffffffffffff50;
  
  paf = (ROOM_AFFECT_DATA *)0x0;
  bVar1 = is_npc((CHAR_DATA *)0x0);
  if (((!bVar1) && (bVar1 = str_cmp(in_RDX,"hakri gwenidill mafre finae"), !bVar1)) &&
     (bVar1 = is_affected_room(*(ROOM_INDEX_DATA **)(in_RSI + 0xa8),(int)gsn_rprog_elven_down),
     !bVar1)) {
    init_affect_room((ROOM_AFFECT_DATA *)0x6bd7ce);
    uVar3 = 0;
    uVar5 = 0;
    sVar4 = gsn_rprog_elven_down;
    affect_to_room(in_stack_ffffffffffffff30,paf);
    act((char *)CONCAT26(in_stack_ffffffffffffff46,
                         CONCAT24(sVar4,CONCAT22(uVar3,in_stack_ffffffffffffff40))),
        in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,paf,0);
    act((char *)CONCAT26(in_stack_ffffffffffffff46,
                         CONCAT24(sVar4,CONCAT22(uVar3,in_stack_ffffffffffffff40))),
        in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,paf,0);
    for (lVar2 = *(long *)(*(long *)(in_RSI + 0xa8) + 0x18); lVar2 != 0;
        lVar2 = *(long *)(lVar2 + 8)) {
      init_affect((AFFECT_DATA *)0x6bd873);
      std::pow<int,int>(0,0x6bd898);
      new_affect_to_char(in_stack_ffffffffffffff50,
                         (AFFECT_DATA *)CONCAT62(in_stack_ffffffffffffff4a,uVar5));
    }
  }
  return;
}

Assistant:

void speech_prog_elven_down(ROOM_INDEX_DATA *room, CHAR_DATA *ch, char *speech)
{
	AFFECT_DATA af;
	ROOM_AFFECT_DATA raf;
	CHAR_DATA *ich = nullptr;

	if (is_npc(ch))
		return;

	if (!str_cmp(speech, "hakri gwenidill mafre finae"))
	{
		if (is_affected_room(ch->in_room, gsn_rprog_elven_down))
			return;

		init_affect_room(&raf);
		raf.where = TO_ROOM_AFFECTS;
		raf.type = gsn_rprog_elven_down;
		raf.aftype = AFT_TIMER;
		raf.duration = 0;
		affect_to_room(ch->in_room, &raf);

		act("A chill wind blows through the room, extinguishing the candle.", ch, 0, 0, TO_CHAR);
		act("A chill wind blows through the room, extinguishing the candle.", ch, 0, 0, TO_ROOM);

		for (ich = ch->in_room->people; ich != nullptr; ich = ich->next_in_room)
		{
			// Small char affect that will restore the original light after a tick.
			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_INVIS;
			af.duration = 0;

			SET_BIT(af.bitvector, AFF_BLIND);

			af.end_fun = rprog_elven_down_end;
			new_affect_to_char(ch, &af);
		}
	}
}